

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movDemuxer.cpp
# Opt level: O3

void __thiscall
MovParsedSRTTrackData::extractData(MovParsedSRTTrackData *this,AVPacket *pkt,uint8_t *buff,int size)

{
  int *x;
  uint uVar1;
  pointer pcVar2;
  undefined1 auVar3 [8];
  pointer ppVar4;
  byte bVar5;
  ushort uVar6;
  int64_t iVar7;
  ulong uVar8;
  uint8_t *puVar9;
  ushort *puVar10;
  long lVar11;
  ushort *puVar12;
  pointer ppVar13;
  uint16_t endChar;
  string prefix;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  tags;
  string suffix;
  string subtitleText;
  undefined1 local_130 [8];
  _Alloc_hider local_128;
  undefined1 local_120 [9];
  undefined7 uStack_117;
  undefined8 uStack_110;
  ushort local_102;
  undefined1 *local_100;
  char *local_f8;
  undefined1 local_f0;
  undefined7 uStack_ef;
  AVPacket *local_e0;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  ushort *local_98;
  ushort local_90;
  char *local_88;
  size_type local_80;
  char local_78;
  undefined7 uStack_77;
  undefined8 uStack_70;
  undefined1 *local_68;
  size_t local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  char *local_48;
  uint8_t *local_40;
  int64_t local_38;
  
  local_100 = &local_f0;
  local_f8 = (char *)0x0;
  local_f0 = 0;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  local_68 = &local_58;
  local_60 = 0;
  local_58 = 0;
  local_d8.
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  local_d8.
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  local_e0 = pkt;
  if (this->m_packetCnt == 0) {
    std::__cxx11::string::_M_replace((ulong)&local_100,0,(char *)0x0,0x20a1f5);
  }
  lVar11 = this->m_timeOffset;
  iVar7 = getSttsVal(this);
  x = &this->m_packetCnt;
  *x = *x + 1;
  int32ToStr_abi_cxx11_((string *)local_130,x);
  std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_130);
  if (local_130 != (undefined1  [8])local_120) {
    operator_delete((void *)local_130,local_120._0_8_ + 1);
  }
  std::__cxx11::string::append((char *)&local_100);
  floatToTime_abi_cxx11_((string *)local_130,(double)lVar11 / 1000.0,',');
  std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_130);
  if (local_130 != (undefined1  [8])local_120) {
    operator_delete((void *)local_130,local_120._0_8_ + 1);
  }
  std::__cxx11::string::append((char *)&local_100);
  lVar11 = iVar7 + lVar11;
  floatToTime_abi_cxx11_((string *)local_130,(double)lVar11 / 1000.0,',');
  std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_130);
  local_38 = lVar11;
  if (local_130 != (undefined1  [8])local_120) {
    operator_delete((void *)local_130,local_120._0_8_ + 1);
  }
  std::__cxx11::string::push_back('\0');
  local_98 = (ushort *)(buff + size);
  puVar9 = local_e0->data;
  memcpy(puVar9,local_100,(size_t)local_f8);
  local_48 = local_f8;
  do {
    uVar6 = *(ushort *)buff << 8 | *(ushort *)buff >> 8;
    buff = (uint8_t *)((long)buff + 2);
  } while (uVar6 == 0);
  puVar10 = (ushort *)((ulong)uVar6 + (long)buff);
  local_130 = (undefined1  [8])local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,buff,puVar10);
  local_e0 = (AVPacket *)this;
  local_40 = puVar9;
  std::__cxx11::string::operator=((string *)&local_68,(string *)local_130);
  if (local_130 != (undefined1  [8])local_120) {
    operator_delete((void *)local_130,local_120._0_8_ + 1);
  }
  if (puVar10 < local_98) {
    do {
      puVar12 = puVar10 + 4;
      lVar11 = (ulong)*(byte *)((long)puVar10 + 3) +
               ((ulong)(byte)puVar10[1] << 8 |
               (long)(int)((uint)(byte)*puVar10 << 0x18) |
               (ulong)*(byte *)((long)puVar10 + 1) << 0x10) + -8;
      if (lVar11 == 1) {
        lVar11 = 0;
        uVar8 = 0;
        do {
          uVar8 = (ulong)*(byte *)((long)puVar12 + lVar11) | uVar8 << 8;
          lVar11 = lVar11 + 1;
        } while ((int)lVar11 != 8);
        puVar12 = puVar10 + 8;
        lVar11 = uVar8 - 8;
      }
      uVar1 = *(uint *)(puVar10 + 2);
      if ((uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18) ==
          0x7374796c) {
        uVar6 = *puVar12 << 8 | *puVar12 >> 8;
        puVar10 = puVar12 + 1;
        if (uVar6 != 0) {
          uVar8 = (ulong)uVar6;
          do {
            std::__cxx11::string::_M_replace((ulong)&local_100,0,local_f8,0x20a201);
            std::__cxx11::string::_M_replace
                      ((ulong)&local_b8,0,(char *)local_b8._M_string_length,0x20a201);
            uVar6 = *puVar10 << 8 | *puVar10 >> 8;
            local_102 = puVar10[1] << 8 | puVar10[1] >> 8;
            if (uVar6 < local_102) {
              bVar5 = (byte)puVar10[3];
              if ((bVar5 & 1) != 0) {
                std::__cxx11::string::append((char *)&local_100);
                std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x20b04a);
                bVar5 = (byte)puVar10[3];
              }
              if ((bVar5 & 2) != 0) {
                std::__cxx11::string::append((char *)&local_100);
                std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x20b053);
                bVar5 = (byte)puVar10[3];
              }
              if ((bVar5 & 4) != 0) {
                std::__cxx11::string::append((char *)&local_100);
                std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x20b05c);
              }
              ppVar4 = local_d8.
                       super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_90 = uVar6;
              local_88 = &local_78;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_88,local_100,local_f8 + (long)local_100);
              auVar3 = local_130;
              local_130._2_2_ = 0;
              local_130._0_2_ = local_90;
              local_130._4_4_ = auVar3._4_4_;
              if (local_88 == &local_78) {
                uStack_110 = uStack_70;
                local_128._M_p = local_120 + 8;
              }
              else {
                local_128._M_p = local_88;
              }
              uStack_117 = uStack_77;
              local_120[8] = local_78;
              local_120._0_8_ = local_80;
              local_80 = 0;
              local_78 = '\0';
              local_88 = &local_78;
              std::
              vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::_M_insert_rval(&local_d8,(const_iterator)ppVar4,(value_type *)local_130);
              if (local_128._M_p != local_120 + 8) {
                operator_delete(local_128._M_p,stack0xfffffffffffffee8 + 1);
              }
              if (local_88 != &local_78) {
                operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
              }
              std::
              vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
              ::emplace_back<unsigned_short&,std::__cxx11::string&>
                        ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                          *)&local_d8,&local_102,&local_b8);
            }
            puVar10 = puVar10 + 6;
            uVar8 = uVar8 - 1;
          } while (uVar8 != 0);
        }
      }
      else {
        puVar10 = (ushort *)((long)puVar12 + lVar11);
      }
    } while (puVar10 < local_98);
  }
  ppVar13 = local_d8.
            super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppVar4 = local_d8.
           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_d8.
      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_d8.
      super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar8 = ((long)local_d8.
                   super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_d8.
                   super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
    lVar11 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,std::__cxx11::string>*,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<void>>>
              (local_d8.
               super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_d8.
               super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,std::__cxx11::string>*,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<void>>>
              (ppVar4,ppVar13);
    ppVar4 = local_d8.
             super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_d8.
        super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_d8.
        super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ppVar13 = local_d8.
                super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_130._0_4_ = ppVar13->first;
        pcVar2 = (ppVar13->second)._M_dataplus._M_p;
        local_128._M_p = local_120 + 8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_128,pcVar2,pcVar2 + (ppVar13->second)._M_string_length);
        std::__cxx11::string::replace
                  ((ulong)&local_68,(long)(int)local_130._0_4_,(char *)0x0,(ulong)local_128._M_p);
        if (local_128._M_p != local_120 + 8) {
          operator_delete(local_128._M_p,stack0xfffffffffffffee8 + 1);
        }
        ppVar13 = ppVar13 + 1;
      } while (ppVar13 != ppVar4);
    }
  }
  puVar9 = local_40 + (long)local_48;
  memcpy(puVar9,local_68,local_60);
  (puVar9 + local_60)[0] = '\n';
  (puVar9 + local_60)[1] = '\n';
  local_e0->codec = (BaseAbstractStreamReader *)local_38;
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_d8);
  if (local_68 != &local_58) {
    operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                             local_b8.field_2._M_local_buf[0]) + 1);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100,CONCAT71(uStack_ef,local_f0) + 1);
  }
  return;
}

Assistant:

void extractData(AVPacket* pkt, uint8_t* buff, int size) override
    {
        uint8_t* end = buff + size;
        std::string prefix;
        std::string suffix;
        std::string subtitleText;
        std::vector<pair<int, string>> tags;
        if (m_packetCnt == 0)
            prefix = "\xEF\xBB\xBF";  // UTF-8 header
        int64_t startTime = m_timeOffset;
        int64_t endTime = startTime + getSttsVal();
        prefix += int32ToStr(++m_packetCnt);
        prefix += "\n";
        prefix += floatToTime(static_cast<double>(startTime) / 1e3, ',');
        prefix += " --> ";
        prefix += floatToTime(static_cast<double>(endTime) / 1e3, ',');
        prefix += '\n';
        uint8_t* dst = pkt->data;
        memcpy(dst, prefix.c_str(), prefix.length());
        dst += prefix.length();
        uint32_t unitSize = 0;

        while (unitSize == 0)
        {
            unitSize = (buff[0] << 8) | buff[1];
            buff += 2;
        }
        subtitleText = std::string(reinterpret_cast<char*>(buff), unitSize);
        buff += unitSize;

        while (buff < end)
        {
            int64_t modifierLen = (buff[0] << 24) | (buff[1] << 16) | (buff[2] << 8) | buff[3];
            uint32_t modifierType = (buff[4] << 24) | (buff[5] << 16) | (buff[6] << 8) | buff[7];
            buff += 8;
            modifierLen -= 8;
            if (modifierLen == 1)  // 64-bit length
            {
                modifierLen = 0;
                for (int i = 0; i < 8; i++)
                {
                    modifierLen <<= 8;
                    modifierLen |= *buff++;
                }
                modifierLen -= 8;
            }
            if (modifierType == 0x7374796C)  // 'styl' box
            {
                auto entry_count = static_cast<uint16_t>(buff[0] << 8 | buff[1]);
                buff += 2;
                for (size_t i = 0; i < entry_count; i++)
                {
                    prefix = "";
                    suffix = "";
                    auto startChar = static_cast<uint16_t>(buff[0] << 8 | buff[1]);
                    auto endChar = static_cast<uint16_t>(buff[2] << 8 | buff[3]);
                    buff += 6;  // startChar, endChar, font_ID
                    if (startChar < endChar)
                    {
                        if (*buff & 1)
                        {
                            prefix += "<b>";
                            suffix.insert(0, "</b>");
                        }
                        if (*buff & 2)
                        {
                            prefix += "<i>";
                            suffix.insert(0, "</i>");
                        }
                        if (*buff & 4)
                        {
                            prefix += "<u>";
                            suffix.insert(0, "</u>");
                        }
                        tags.insert(tags.begin(), std::make_pair(startChar, prefix));
                        tags.emplace_back(endChar, suffix);
                    }
                    buff += 6;  // font-size, text-color-rgba[4]
                }
            }
            else
                buff += modifierLen;
        }
        if (!tags.empty())
        {
            sort(tags.begin(), tags.end(), greater<>());
            for (auto [fst, snd] : tags) subtitleText.insert(fst, snd);
        }
        memcpy(dst, subtitleText.c_str(), subtitleText.length());
        dst += subtitleText.length();
        *dst++ = '\n';
        *dst = '\n';
        m_timeOffset = endTime;
    }